

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<unsigned_int>::emplace<unsigned_int&>
          (QPodArrayOps<unsigned_int> *this,qsizetype i,uint *args)

{
  qsizetype *pqVar1;
  uint uVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  uint *puVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<unsigned_int>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<unsigned_int>).size == i) &&
       (qVar5 = QArrayDataPointer<unsigned_int>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<unsigned_int>), qVar5 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<unsigned_int>).size;
      (this->super_QArrayDataPointer<unsigned_int>).ptr[lVar4] = *args;
      (this->super_QArrayDataPointer<unsigned_int>).size = lVar4 + 1;
      return;
    }
    if ((i == 0) &&
       (qVar5 = QArrayDataPointer<unsigned_int>::freeSpaceAtBegin
                          (&this->super_QArrayDataPointer<unsigned_int>), qVar5 != 0)) {
      puVar6 = (this->super_QArrayDataPointer<unsigned_int>).ptr;
      puVar6[-1] = *args;
      (this->super_QArrayDataPointer<unsigned_int>).ptr = puVar6 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<unsigned_int>).size;
      *pqVar1 = *pqVar1 + 1;
      return;
    }
  }
  uVar2 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<unsigned_int>).size != 0);
  QArrayDataPointer<unsigned_int>::detachAndGrow
            (&this->super_QArrayDataPointer<unsigned_int>,where,1,(uint **)0x0,
             (QArrayDataPointer<unsigned_int> *)0x0);
  puVar6 = createHole(this,where,i,1);
  *puVar6 = uVar2;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }